

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O0

int __thiscall
btGeneric6DofConstraint::setAngularLimits
          (btGeneric6DofConstraint *this,btConstraintInfo2 *info,int row_offset,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  btRotationalLimitMotor *this_00;
  int in_EDX;
  long in_RSI;
  btGeneric6DofConstraint *in_RDI;
  int flags;
  btVector3 axis;
  int i;
  int row;
  btGeneric6DofConstraint *d6constraint;
  btVector3 *in_stack_000001b0;
  btVector3 *in_stack_000001b8;
  btTransform *in_stack_000001c0;
  btTransform *in_stack_000001c8;
  btRotationalLimitMotor *in_stack_000001d0;
  btGeneric6DofConstraint *in_stack_000001d8;
  btVector3 *in_stack_000001f0;
  btVector3 *in_stack_000001f8;
  btConstraintInfo2 *in_stack_00000200;
  int in_stack_00000208;
  btVector3 *in_stack_00000210;
  int in_stack_00000218;
  int in_stack_00000220;
  int local_58;
  int local_54;
  
  local_54 = in_EDX;
  for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
    this_00 = getRotationalLimitMotor(in_RDI,local_58);
    bVar1 = btRotationalLimitMotor::needApplyTorques(this_00);
    if (bVar1) {
      getAxis(in_RDI,local_58);
      uVar2 = in_RDI->m_flags >> (((char)local_58 + '\x03') * '\x03' & 0x1fU);
      if ((uVar2 & 1) == 0) {
        in_RDI->m_angularLimits[local_58].m_normalCFM = **(btScalar **)(in_RSI + 0x38);
      }
      if ((uVar2 & 2) == 0) {
        in_RDI->m_angularLimits[local_58].m_stopCFM = **(btScalar **)(in_RSI + 0x38);
      }
      if ((uVar2 & 4) == 0) {
        in_RDI->m_angularLimits[local_58].m_stopERP = *(btScalar *)(in_RSI + 4);
      }
      getRotationalLimitMotor(in_RDI,local_58);
      iVar3 = get_limit_motor_info2
                        (in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,
                         in_stack_000001b8,in_stack_000001b0,in_stack_000001f0,in_stack_000001f8,
                         in_stack_00000200,in_stack_00000208,in_stack_00000210,in_stack_00000218,
                         in_stack_00000220);
      local_54 = iVar3 + local_54;
    }
  }
  return local_54;
}

Assistant:

int btGeneric6DofConstraint::setAngularLimits(btConstraintInfo2 *info, int row_offset, const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB)
{
	btGeneric6DofConstraint * d6constraint = this;
	int row = row_offset;
	//solve angular limits
	for (int i=0;i<3 ;i++ )
	{
		if(d6constraint->getRotationalLimitMotor(i)->needApplyTorques())
		{
			btVector3 axis = d6constraint->getAxis(i);
			int flags = m_flags >> ((i + 3) * BT_6DOF_FLAGS_AXIS_SHIFT);
			if(!(flags & BT_6DOF_FLAGS_CFM_NORM))
			{
				m_angularLimits[i].m_normalCFM = info->cfm[0];
			}
			if(!(flags & BT_6DOF_FLAGS_CFM_STOP))
			{
				m_angularLimits[i].m_stopCFM = info->cfm[0];
			}
			if(!(flags & BT_6DOF_FLAGS_ERP_STOP))
			{
				m_angularLimits[i].m_stopERP = info->erp;
			}
			row += get_limit_motor_info2(d6constraint->getRotationalLimitMotor(i),
												transA,transB,linVelA,linVelB,angVelA,angVelB, info,row,axis,1);
		}
	}

	return row;
}